

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_LongFlag_Test::~OptionParser_LongFlag_Test(OptionParser_LongFlag_Test *this)

{
  OptionParser_LongFlag_Test *this_local;
  
  ~OptionParser_LongFlag_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(OptionParser, LongFlag) {
  bool flag = false;
  OptionParser parser("prog", "desc");
  parser.AddOption("flag", "help", [&]() { flag = true; });
  const char* args[] = {"prog name", "--flag"};
  parser.Parse(2, const_cast<char**>(args));
  EXPECT_EQ(true, flag);
}